

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device__post_init_setup(ma_device *pDevice,ma_device_type deviceType)

{
  ma_result mVar1;
  ma_uint32 local_217c;
  ma_uint32 local_2164;
  ma_uint32 local_214c;
  ma_uint32 local_2134;
  undefined1 local_2120 [8];
  ma_data_converter_config converterConfig_1;
  ma_data_converter_config converterConfig;
  ma_result result;
  ma_device_type deviceType_local;
  ma_device *pDevice_local;
  
  converterConfig.resampling._28_4_ = deviceType;
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0x7df7,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
  }
  if (((deviceType == ma_device_type_capture) || (deviceType == ma_device_type_duplex)) ||
     (deviceType == ma_device_type_loopback)) {
    if ((pDevice->capture).format == ma_format_unknown) {
      (pDevice->capture).format = (pDevice->capture).internalFormat;
    }
    if ((pDevice->capture).channels == 0) {
      (pDevice->capture).channels = (pDevice->capture).internalChannels;
    }
    if ((pDevice->capture).channelMap[0] == '\0') {
      if (0x20 < (pDevice->capture).channels) {
        __assert_fail("pDevice->capture.channels <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0x7e01,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      if ((pDevice->capture).internalChannels == (pDevice->capture).channels) {
        ma_channel_map_copy((pDevice->capture).channelMap,(pDevice->capture).internalChannelMap,
                            (pDevice->capture).channels);
      }
      else if ((pDevice->capture).channelMixMode == ma_channel_mix_mode_simple) {
        ma_channel_map_init_blank((pDevice->capture).channels,(pDevice->capture).channelMap);
      }
      else {
        ma_get_standard_channel_map
                  (ma_standard_channel_map_default,(pDevice->capture).channels,
                   (pDevice->capture).channelMap);
      }
    }
  }
  if ((converterConfig.resampling._28_4_ == 1) || (converterConfig.resampling._28_4_ == 3)) {
    if ((pDevice->playback).format == ma_format_unknown) {
      (pDevice->playback).format = (pDevice->playback).internalFormat;
    }
    if ((pDevice->playback).channels == 0) {
      (pDevice->playback).channels = (pDevice->playback).internalChannels;
    }
    if ((pDevice->playback).channelMap[0] == '\0') {
      if (0x20 < (pDevice->playback).channels) {
        __assert_fail("pDevice->playback.channels <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                      ,0x7e16,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      if ((pDevice->playback).internalChannels == (pDevice->playback).channels) {
        ma_channel_map_copy((pDevice->playback).channelMap,(pDevice->playback).internalChannelMap,
                            (pDevice->playback).channels);
      }
      else if ((pDevice->playback).channelMixMode == ma_channel_mix_mode_simple) {
        ma_channel_map_init_blank((pDevice->playback).channels,(pDevice->playback).channelMap);
      }
      else {
        ma_get_standard_channel_map
                  (ma_standard_channel_map_default,(pDevice->playback).channels,
                   (pDevice->playback).channelMap);
      }
    }
  }
  if (pDevice->sampleRate == 0) {
    if (((converterConfig.resampling._28_4_ == 2) || (converterConfig.resampling._28_4_ == 3)) ||
       (converterConfig.resampling._28_4_ == 4)) {
      pDevice->sampleRate = (pDevice->capture).internalSampleRate;
    }
    else {
      pDevice->sampleRate = (pDevice->playback).internalSampleRate;
    }
  }
  if (((converterConfig.resampling._28_4_ == 2) || (converterConfig.resampling._28_4_ == 3)) ||
     (converterConfig.resampling._28_4_ == 4)) {
    ma_data_converter_config_init_default();
    converterConfig_1.resampling.speex.quality = (pDevice->capture).internalFormat;
    converterConfig.formatIn = (pDevice->capture).internalChannels;
    converterConfig.channelsIn = (pDevice->capture).internalSampleRate;
    if ((pDevice->capture).internalChannels < 0x20) {
      local_2134 = (pDevice->capture).internalChannels;
    }
    else {
      local_2134 = 0x20;
    }
    ma_channel_map_copy((ma_channel *)&converterConfig.sampleRateIn,
                        (pDevice->capture).internalChannelMap,local_2134);
    converterConfig_1.resampling._28_4_ = (pDevice->capture).format;
    converterConfig.formatOut = (pDevice->capture).channels;
    converterConfig.channelsOut = pDevice->sampleRate;
    if ((pDevice->capture).channels < 0x20) {
      local_214c = (pDevice->capture).channels;
    }
    else {
      local_214c = 0x20;
    }
    ma_channel_map_copy(converterConfig.channelMapIn + 0x18,(pDevice->capture).channelMap,local_214c
                       );
    converterConfig.channelMapOut._28_4_ = (pDevice->capture).channelMixMode;
    converterConfig.channelWeights[0x1f][0x1f] = 0.0;
    converterConfig.channelWeights[0x1f][0x1e] = (float)(pDevice->resampling).algorithm;
    converterConfig.resampling.algorithm = (pDevice->resampling).linear.lpfOrder;
    converterConfig.resampling.linear.lpfNyquistFactor._0_4_ = (pDevice->resampling).speex.quality;
    mVar1 = ma_data_converter_init
                      ((ma_data_converter_config *)&converterConfig_1.resampling.speex,
                       &(pDevice->capture).converter);
    if (mVar1 != 0) {
      return mVar1;
    }
    converterConfig.resampling.speex.quality = 0;
  }
  if ((converterConfig.resampling._28_4_ == 1) || (converterConfig.resampling._28_4_ == 3)) {
    ma_data_converter_config_init_default();
    local_2120._0_4_ = (pDevice->playback).format;
    converterConfig_1.formatIn = (pDevice->playback).channels;
    converterConfig_1.channelsIn = pDevice->sampleRate;
    if ((pDevice->playback).channels < 0x20) {
      local_2164 = (pDevice->playback).channels;
    }
    else {
      local_2164 = 0x20;
    }
    ma_channel_map_copy((ma_channel *)&converterConfig_1.sampleRateIn,(pDevice->playback).channelMap
                        ,local_2164);
    local_2120._4_4_ = (pDevice->playback).internalFormat;
    converterConfig_1.formatOut = (pDevice->playback).internalChannels;
    converterConfig_1.channelsOut = (pDevice->playback).internalSampleRate;
    if ((pDevice->playback).internalChannels < 0x20) {
      local_217c = (pDevice->playback).internalChannels;
    }
    else {
      local_217c = 0x20;
    }
    ma_channel_map_copy(converterConfig_1.channelMapIn + 0x18,(pDevice->playback).internalChannelMap
                        ,local_217c);
    converterConfig_1.channelMapOut._28_4_ = (pDevice->playback).channelMixMode;
    converterConfig_1.channelWeights[0x1f][0x1f] = 0.0;
    converterConfig_1.channelWeights[0x1f][0x1e] = (float)(pDevice->resampling).algorithm;
    converterConfig_1.resampling.algorithm = (pDevice->resampling).linear.lpfOrder;
    converterConfig_1.resampling.linear.lpfNyquistFactor._0_4_ = (pDevice->resampling).speex.quality
    ;
    mVar1 = ma_data_converter_init
                      ((ma_data_converter_config *)local_2120,&(pDevice->playback).converter);
    if (mVar1 != 0) {
      return mVar1;
    }
  }
  return 0;
}

Assistant:

static ma_result ma_device__post_init_setup(ma_device* pDevice, ma_device_type deviceType)
{
    ma_result result;

    MA_ASSERT(pDevice != NULL);

    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (pDevice->capture.format == ma_format_unknown) {
            pDevice->capture.format = pDevice->capture.internalFormat;
        }
        if (pDevice->capture.channels == 0) {
            pDevice->capture.channels = pDevice->capture.internalChannels;
        }
        if (pDevice->capture.channelMap[0] == MA_CHANNEL_NONE) {
            MA_ASSERT(pDevice->capture.channels <= MA_MAX_CHANNELS);
            if (pDevice->capture.internalChannels == pDevice->capture.channels) {
                ma_channel_map_copy(pDevice->capture.channelMap, pDevice->capture.internalChannelMap, pDevice->capture.channels);
            } else {
                if (pDevice->capture.channelMixMode == ma_channel_mix_mode_simple) {
                    ma_channel_map_init_blank(pDevice->capture.channels, pDevice->capture.channelMap);
                } else {
                    ma_get_standard_channel_map(ma_standard_channel_map_default, pDevice->capture.channels, pDevice->capture.channelMap);
                }
            }
        }
    }

    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (pDevice->playback.format == ma_format_unknown) {
            pDevice->playback.format = pDevice->playback.internalFormat;
        }
        if (pDevice->playback.channels == 0) {
            pDevice->playback.channels = pDevice->playback.internalChannels;
        }
        if (pDevice->playback.channelMap[0] == MA_CHANNEL_NONE) {
            MA_ASSERT(pDevice->playback.channels <= MA_MAX_CHANNELS);
            if (pDevice->playback.internalChannels == pDevice->playback.channels) {
                ma_channel_map_copy(pDevice->playback.channelMap, pDevice->playback.internalChannelMap, pDevice->playback.channels);
            } else {
                if (pDevice->playback.channelMixMode == ma_channel_mix_mode_simple) {
                    ma_channel_map_init_blank(pDevice->playback.channels, pDevice->playback.channelMap);
                } else {
                    ma_get_standard_channel_map(ma_standard_channel_map_default, pDevice->playback.channels, pDevice->playback.channelMap);
                }
            }
        }
    }

    if (pDevice->sampleRate == 0) {
        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            pDevice->sampleRate = pDevice->capture.internalSampleRate;
        } else {
            pDevice->sampleRate = pDevice->playback.internalSampleRate;
        }
    }

    /* Data converters. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        /* Converting from internal device format to client format. */
        ma_data_converter_config converterConfig = ma_data_converter_config_init_default();
        converterConfig.formatIn                   = pDevice->capture.internalFormat;
        converterConfig.channelsIn                 = pDevice->capture.internalChannels;
        converterConfig.sampleRateIn               = pDevice->capture.internalSampleRate;
        ma_channel_map_copy(converterConfig.channelMapIn, pDevice->capture.internalChannelMap, ma_min(pDevice->capture.internalChannels, MA_MAX_CHANNELS));
        converterConfig.formatOut                  = pDevice->capture.format;
        converterConfig.channelsOut                = pDevice->capture.channels;
        converterConfig.sampleRateOut              = pDevice->sampleRate;
        ma_channel_map_copy(converterConfig.channelMapOut, pDevice->capture.channelMap, ma_min(pDevice->capture.channels, MA_MAX_CHANNELS));
        converterConfig.channelMixMode             = pDevice->capture.channelMixMode;
        converterConfig.resampling.allowDynamicSampleRate = MA_FALSE;
        converterConfig.resampling.algorithm       = pDevice->resampling.algorithm;
        converterConfig.resampling.linear.lpfOrder = pDevice->resampling.linear.lpfOrder;
        converterConfig.resampling.speex.quality   = pDevice->resampling.speex.quality;

        result = ma_data_converter_init(&converterConfig, &pDevice->capture.converter);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        /* Converting from client format to device format. */
        ma_data_converter_config converterConfig = ma_data_converter_config_init_default();
        converterConfig.formatIn                   = pDevice->playback.format;
        converterConfig.channelsIn                 = pDevice->playback.channels;
        converterConfig.sampleRateIn               = pDevice->sampleRate;
        ma_channel_map_copy(converterConfig.channelMapIn, pDevice->playback.channelMap, ma_min(pDevice->playback.channels, MA_MAX_CHANNELS));
        converterConfig.formatOut                  = pDevice->playback.internalFormat;
        converterConfig.channelsOut                = pDevice->playback.internalChannels;
        converterConfig.sampleRateOut              = pDevice->playback.internalSampleRate;
        ma_channel_map_copy(converterConfig.channelMapOut, pDevice->playback.internalChannelMap, ma_min(pDevice->playback.internalChannels, MA_MAX_CHANNELS));
        converterConfig.channelMixMode             = pDevice->playback.channelMixMode;
        converterConfig.resampling.allowDynamicSampleRate = MA_FALSE;
        converterConfig.resampling.algorithm       = pDevice->resampling.algorithm;
        converterConfig.resampling.linear.lpfOrder = pDevice->resampling.linear.lpfOrder;
        converterConfig.resampling.speex.quality   = pDevice->resampling.speex.quality;

        result = ma_data_converter_init(&converterConfig, &pDevice->playback.converter);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}